

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execBcc<(moira::Instr)16,(moira::Mode)12,(moira::Size)1>(Moira *this,u16 opcode)

{
  AEStackFrame frame;
  undefined8 uVar1;
  bool bVar2;
  u32 addr;
  undefined2 in_SI;
  Moira *in_RDI;
  AEStackFrame AVar3;
  u32 newpc;
  Moira *in_stack_ffffffffffffffe0;
  u32 in_stack_ffffffffffffffe8;
  u32 in_stack_ffffffffffffffec;
  undefined2 in_stack_fffffffffffffff4;
  
  (*in_RDI->_vptr_Moira[0x19])(in_RDI,2);
  bVar2 = cond<(moira::Instr)16>(in_RDI);
  if (bVar2) {
    addr = (in_RDI->reg).pc + (int)(char)in_SI;
    bVar2 = misaligned<(moira::Size)2>(in_RDI,addr);
    if (bVar2) {
      AVar3 = makeFrame<0ul>((Moira *)CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,addr)),
                             in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
      uVar1 = AVar3._8_8_;
      frame.ird = (short)addr;
      frame.sr = (short)(addr >> 0x10);
      frame.code = (short)uVar1;
      frame._2_2_ = (short)((ulong)uVar1 >> 0x10);
      frame.addr = (int)((ulong)uVar1 >> 0x20);
      frame.pc._0_2_ = in_stack_fffffffffffffff4;
      frame.pc._2_2_ = in_SI;
      execAddressError(AVar3._0_8_,frame,(int)((ulong)in_RDI >> 0x20));
    }
    else {
      (in_RDI->reg).pc = addr;
      fullPrefetch<4ul,0>((Moira *)CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,addr)));
    }
  }
  else {
    (*in_RDI->_vptr_Moira[0x19])(in_RDI,2);
    prefetch<4ul>(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void
Moira::execBcc(u16 opcode)
{
    sync(2);
    if (cond<I>()) {

        u32 newpc = reg.pc + (S == Word ? (i16)queue.irc : (i8)opcode);
        
        // Check for address error
        if (misaligned<Word>(newpc)) {
            execAddressError(makeFrame(newpc, reg.pc));
            return;
        }
                
        // Take branch
        reg.pc = newpc;
        fullPrefetch<POLLIPL>();

    } else {

        // Fall through to next instruction
        sync(2);
        if (S == Word) readExt();
        prefetch<POLLIPL>();
    }
}